

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O2

int bip32_key_get_fingerprint(ext_key *hdkey,uchar *bytes_out,size_t len)

{
  _Bool _Var1;
  int iVar2;
  
  iVar2 = -2;
  if (hdkey != (ext_key *)0x0) {
    _Var1 = key_is_valid(hdkey);
    if (((len == 4) && (bytes_out != (uchar *)0x0)) && (_Var1)) {
      _Var1 = mem_is_zero(hdkey->hash160,0x14);
      if (_Var1) {
        key_compute_hash160(hdkey);
      }
      *(undefined4 *)bytes_out = *(undefined4 *)hdkey->hash160;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int bip32_key_get_fingerprint(struct ext_key *hdkey,
                              unsigned char *bytes_out, size_t len)
{
    /* Validate our arguments and then the input key */
    if (!hdkey ||
        !key_is_valid(hdkey) ||
        !bytes_out || len != BIP32_KEY_FINGERPRINT_LEN)
        return WALLY_EINVAL;

    /* Derive hash160 if needed. */
    if (mem_is_zero(hdkey->hash160, sizeof(hdkey->hash160))) {
        key_compute_hash160(hdkey);
    }

    /* Fingerprint is first 32 bits of the key hash. */
    memcpy(bytes_out, hdkey->hash160, BIP32_KEY_FINGERPRINT_LEN);
    return WALLY_OK;
}